

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t terminal__putc(EditLine *el,wint_t c)

{
  char *__s;
  ssize_t sVar1;
  ssize_t i;
  char buf [17];
  wint_t c_local;
  EditLine *el_local;
  
  if (c == 0xffffffff) {
    el_local._4_4_ = L'\0';
  }
  else if ((c & 0x80000000) == 0) {
    sVar1 = ct_encode_char((char *)&i,0x10,c);
    if (sVar1 < 1) {
      el_local._4_4_ = (wchar_t)sVar1;
    }
    else {
      buf[sVar1 + -8] = '\0';
      el_local._4_4_ = fputs((char *)&i,(FILE *)el->el_outfile);
    }
  }
  else {
    __s = literal_get(el,c);
    el_local._4_4_ = fputs(__s,(FILE *)el->el_outfile);
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
terminal__putc(EditLine *el, wint_t c)
{
	char buf[MB_LEN_MAX +1];
	ssize_t i;
	if (c == MB_FILL_CHAR)
		return 0;
	if (c & EL_LITERAL)
		return fputs(literal_get(el, c), el->el_outfile);
	i = ct_encode_char(buf, (size_t)MB_LEN_MAX, c);
	if (i <= 0)
		return (int)i;
	buf[i] = '\0';
	return fputs(buf, el->el_outfile);
}